

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall
discordpp::User::User
          (User *this,field<discordpp::Snowflake> *id,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *username,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *discriminator,
          nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *avatar,omittable_field<bool> *bot,omittable_field<bool> *system,
          omittable_field<bool> *mfa_enabled,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *banner,nullable_omittable_field<int> *accent_color,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *locale,omittable_field<bool> *verified,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *email,omittable_field<int> *flags,omittable_field<int> *premium_type,
          omittable_field<int> *public_flags)

{
  omittable_field<bool> *bot_local;
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *avatar_local;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *discriminator_local;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *username_local;
  field<discordpp::Snowflake> *id_local;
  User *this_local;
  
  field<discordpp::Snowflake>::field(&this->id,id);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->username,username);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->discriminator,discriminator);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  nullable_field(&this->avatar,avatar);
  omittable_field<bool>::omittable_field(&this->bot,bot);
  omittable_field<bool>::omittable_field(&this->system,system);
  omittable_field<bool>::omittable_field(&this->mfa_enabled,mfa_enabled);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->banner,banner);
  nullable_omittable_field<int>::nullable_omittable_field(&this->accent_color,accent_color);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->locale,locale);
  omittable_field<bool>::omittable_field(&this->verified,verified);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->email,email);
  omittable_field<int>::omittable_field(&this->flags,flags);
  omittable_field<int>::omittable_field(&this->premium_type,premium_type);
  omittable_field<int>::omittable_field(&this->public_flags,public_flags);
  return;
}

Assistant:

User(
        field<Snowflake> id = uninitialized,
        field<std::string> username = uninitialized,
        field<std::string> discriminator = uninitialized,
        nullable_field<std::string> avatar = uninitialized,
        omittable_field<bool> bot = omitted,
        omittable_field<bool> system = omitted,
        omittable_field<bool> mfa_enabled = omitted,
        nullable_omittable_field<std::string> banner = omitted,
        nullable_omittable_field<int> accent_color = omitted,
        omittable_field<std::string> locale = omitted,
        omittable_field<bool> verified = omitted,
        nullable_omittable_field<std::string> email = omitted,
        omittable_field<int> flags = omitted,
        omittable_field<int> premium_type = omitted,
        omittable_field<int> public_flags = omitted
    ):
        id(id),
        username(username),
        discriminator(discriminator),
        avatar(avatar),
        bot(bot),
        system(system),
        mfa_enabled(mfa_enabled),
        banner(banner),
        accent_color(accent_color),
        locale(locale),
        verified(verified),
        email(email),
        flags(flags),
        premium_type(premium_type),
        public_flags(public_flags)
    {}